

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::RegisterTypeParameterizedTestSuite
               (char *test_suite_name,CodeLocation *code_location)

{
  CodeLocation *test_suite_name_00;
  UnitTestImpl *this;
  TypeParameterizedTestSuiteRegistry *this_00;
  CodeLocation local_40;
  CodeLocation *local_18;
  CodeLocation *code_location_local;
  char *test_suite_name_local;
  
  local_18 = code_location;
  code_location_local = (CodeLocation *)test_suite_name;
  this = GetUnitTestImpl();
  this_00 = UnitTestImpl::type_parameterized_test_registry(this);
  test_suite_name_00 = code_location_local;
  CodeLocation::CodeLocation(&local_40,code_location);
  TypeParameterizedTestSuiteRegistry::RegisterTestSuite
            (this_00,(char *)test_suite_name_00,&local_40);
  CodeLocation::~CodeLocation(&local_40);
  return;
}

Assistant:

void RegisterTypeParameterizedTestSuite(const char* test_suite_name,
                                        CodeLocation code_location) {
  GetUnitTestImpl()->type_parameterized_test_registry().RegisterTestSuite(
      test_suite_name, std::move(code_location));
}